

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O3

char * __thiscall QListModel::index(QListModel *this,char *__s,int __c)

{
  long *plVar1;
  QAbstractItemModel *pQVar2;
  ulong uVar3;
  int iVar4;
  undefined4 in_register_00000014;
  long lVar5;
  ulong uVar6;
  
  lVar5 = CONCAT44(in_register_00000014,__c);
  if ((((lVar5 != 0) && (*(QAbstractItemView **)(lVar5 + 0x10) != (QAbstractItemView *)0x0)) &&
      (pQVar2 = QAbstractItemView::model(*(QAbstractItemView **)(lVar5 + 0x10)),
      pQVar2 == (QAbstractItemModel *)__s)) && (uVar3 = *(ulong *)(__s + 0x20), uVar3 != 0)) {
    iVar4 = *(int *)(*(long *)(lVar5 + 0x18) + 0x20);
    uVar6 = (ulong)iVar4;
    if ((((long)uVar6 < 0) || (uVar3 <= uVar6)) ||
       (*(long *)(*(long *)(__s + 0x18) + uVar6 * 8) != lVar5)) {
      uVar3 = uVar3 << 3;
      do {
        if (uVar3 == 0) goto LAB_0057a5c8;
        uVar6 = uVar3 - 8;
        plVar1 = (long *)(*(long *)(__s + 0x18) + -8 + uVar3);
        uVar3 = uVar6;
      } while (*plVar1 != lVar5);
      iVar4 = (int)(uVar6 >> 3);
      if (iVar4 == -1) goto LAB_0057a5c8;
      *(int *)(*(long *)(lVar5 + 0x18) + 0x20) = iVar4;
    }
    *(int *)this = iVar4;
    *(undefined4 *)&this->field_0x4 = 0;
    *(long *)&this->field_0x8 = lVar5;
    (this->items).d.d = (Data *)__s;
    return (char *)this;
  }
LAB_0057a5c8:
  *(undefined8 *)this = 0xffffffffffffffff;
  *(undefined8 *)&this->field_0x8 = 0;
  (this->items).d.d = (Data *)0x0;
  return (char *)this;
}

Assistant:

QModelIndex QListModel::index(const QListWidgetItem *item_) const
{
    QListWidgetItem *item = const_cast<QListWidgetItem *>(item_);
    if (!item || !item->view || static_cast<const QListModel *>(item->view->model()) != this
        || items.isEmpty())
        return QModelIndex();
    int row;
    const int theid = item->d->theid;
    if (theid >= 0 && theid < items.size() && items.at(theid) == item) {
        row = theid;
    } else { // we need to search for the item
        row = items.lastIndexOf(item);  // lastIndexOf is an optimization in favor of indexOf
        if (row == -1) // not found
            return QModelIndex();
        item->d->theid = row;
    }
    return createIndex(row, 0, item);
}